

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtarjan.c
# Opt level: O0

void RDL_tarjanVisit(RDL_graph *graph,uint start,uint *d,uint *low,uint *time,uint *curr_bcc,
                    uint *bcc,RDL_stack *edge_stack)

{
  uint uVar1;
  uint uVar2;
  uint to;
  int iVar3;
  uint uVar4;
  RDL_stack *stack;
  uint *element_00;
  void *__ptr;
  uint *puVar5;
  uint *element_01;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint next_free_dfs_element;
  RDL_dfsStackElement *dfs_elements;
  RDL_stack *dfs_stack;
  RDL_dfsStackElement *dfs_element_new;
  RDL_dfsStackElement *dfs_element;
  uint next_free_edge_element;
  uint *edge_elements;
  uint *element;
  uint parent;
  uint u;
  uint uv_edge;
  uint curr_edge;
  uint v;
  uint j;
  uint *curr_bcc_local;
  uint *time_local;
  uint *low_local;
  uint *d_local;
  uint start_local;
  RDL_graph *graph_local;
  
  dfs_element._4_4_ = 0;
  stack = RDL_stack_new();
  element_00 = (uint *)malloc((ulong)graph->V << 4);
  local_8c = 1;
  *element_00 = start;
  element_00[1] = 0xffffffff;
  element_00[2] = 0;
  element_00[3] = 0xffffffff;
  *time = *time + 1;
  d[start] = *time;
  low[start] = d[start];
  RDL_stack_push(stack,element_00);
  __ptr = malloc((ulong)graph->E << 2);
  while (iVar3 = RDL_stack_empty(stack), iVar3 == 0) {
    puVar5 = (uint *)RDL_stack_top(stack);
    uVar1 = *puVar5;
    uVar2 = puVar5[1];
    if (puVar5[2] < graph->degree[uVar1]) {
      to = graph->adjList[uVar1][puVar5[2]][0];
      uVar4 = RDL_edgeId(graph,uVar1,to);
      if (d[to] == 0) {
        *(uint *)((long)__ptr + (ulong)dfs_element._4_4_ * 4) = uVar4;
        RDL_stack_push(edge_stack,(void *)((long)__ptr + (ulong)dfs_element._4_4_ * 4));
        dfs_element._4_4_ = dfs_element._4_4_ + 1;
        *time = *time + 1;
        d[to] = *time;
        low[to] = d[to];
        element_01 = element_00 + (ulong)local_8c * 4;
        local_8c = local_8c + 1;
        *element_01 = to;
        element_01[1] = uVar1;
        element_01[2] = 0;
        element_01[3] = 0xffffffff;
        RDL_stack_push(stack,element_01);
        puVar5[3] = *time;
      }
      else {
        puVar5[2] = puVar5[2] + 1;
        if (d[to] == puVar5[3]) {
          if (low[uVar1] < low[to]) {
            local_90 = low[uVar1];
          }
          else {
            local_90 = low[to];
          }
          low[uVar1] = local_90;
          if (d[uVar1] <= low[to]) {
            do {
              puVar5 = (uint *)RDL_stack_top(edge_stack);
              uVar1 = *puVar5;
              RDL_stack_pop(edge_stack);
              bcc[uVar1] = *curr_bcc;
            } while (uVar1 != uVar4);
            *curr_bcc = *curr_bcc + 1;
          }
        }
        else if ((d[to] < d[uVar1]) && (to != uVar2)) {
          *(uint *)((long)__ptr + (ulong)dfs_element._4_4_ * 4) = uVar4;
          RDL_stack_push(edge_stack,(void *)((long)__ptr + (ulong)dfs_element._4_4_ * 4));
          dfs_element._4_4_ = dfs_element._4_4_ + 1;
          if (low[uVar1] < d[to]) {
            local_94 = low[uVar1];
          }
          else {
            local_94 = d[to];
          }
          low[uVar1] = local_94;
        }
      }
    }
    else {
      RDL_stack_pop(stack);
    }
  }
  free(__ptr);
  free(element_00);
  RDL_stack_delete(stack);
  return;
}

Assistant:

static void RDL_tarjanVisit(const RDL_graph* graph, unsigned start, unsigned* d,
    unsigned* low, unsigned* time, unsigned* curr_bcc, unsigned* bcc,
    RDL_stack* edge_stack)
{
  unsigned j, v, curr_edge, uv_edge, u, parent;
  unsigned *element;
  unsigned *edge_elements;
  unsigned next_free_edge_element = 0;

  RDL_dfsStackElement *dfs_element, *dfs_element_new;
  RDL_stack* dfs_stack;

  RDL_dfsStackElement *dfs_elements;
  unsigned next_free_dfs_element = 0;

  dfs_stack = RDL_stack_new();

  dfs_elements = malloc(graph->V * sizeof(*dfs_elements));
  dfs_element = &(dfs_elements[next_free_dfs_element]);
  ++next_free_dfs_element;

  dfs_element->u = start;
  dfs_element->parent = UINT_MAX;
  dfs_element->j = 0;
  dfs_element->expected_time = UINT_MAX;
  ++(*time);
  d[start] = *time;
  low[start] = d[start];

  RDL_stack_push(dfs_stack, dfs_element);

  edge_elements = malloc(graph->E * sizeof(*edge_elements));

  while (!RDL_stack_empty(dfs_stack)) {

    dfs_element = RDL_stack_top(dfs_stack);
    u = dfs_element->u;
    parent = dfs_element->parent;
    j = dfs_element->j;

    /* while there is one node left in it's adjacency list */
    if (j < graph->degree[u]) {
      v = graph->adjList[u][j][0];
      uv_edge = RDL_edgeId(graph, u, v);

      /* if looking at this node this neighbour the first time */
      if (d[v] == 0) {
        /* DO NOT ADVANCE j, we'll be looking at this node again */
        /* push edge onto edge_stack as in tarjan's */
        edge_elements[next_free_edge_element] = uv_edge;
        RDL_stack_push(edge_stack, &(edge_elements[next_free_edge_element]));
        ++next_free_edge_element;

        ++(*time);
        d[v] = *time;
        low[v] = d[v];

        /* and recurse */
        dfs_element_new = &(dfs_elements[next_free_dfs_element]);
        ++next_free_dfs_element;
        dfs_element_new->u = v;
        dfs_element_new->parent = u;
        dfs_element_new->j = 0;
        dfs_element_new->expected_time = UINT_MAX;
        RDL_stack_push(dfs_stack, dfs_element_new);
        /*
         * THIS IS IMPORTANT: this is the time we expect for v to
         * be discovered when we come back to u
         */
        dfs_element->expected_time = (*time);
      }
      else {
        /* in all other cases, we'll NOT be looking again at this neighbour */
        ++dfs_element->j;

        /*
         * this is interesting: if we're looking at this neighbour the
         * second time and d[v] == d[u] + 1 we're back from recursion
         * and this neighbour was discovered when recursing from u as parent
         */
        if (d[v] == dfs_element->expected_time) {
          /* do tarjan's stuff */
          low[u] = low[u] < low[v] ? low[u] : low[v];
          if (low[v] >= d[u]) {
            do {
              element = RDL_stack_top(edge_stack);
              curr_edge = *element;
              RDL_stack_pop(edge_stack);

              bcc[curr_edge] = *curr_bcc;
            } while (curr_edge != uv_edge);
            ++(*curr_bcc);
          }
        }
        /*
         * this is looking at v as u's neighbour the first time, but
         * v was already discovered
         */
        else if (d[v] < d[u] && v != parent) {
          /* do tarjan's stuff */
          edge_elements[next_free_edge_element] = uv_edge;
          RDL_stack_push(edge_stack, &(edge_elements[next_free_edge_element]));
          ++next_free_edge_element;
          low[u] = low[u] < d[v] ? low[u] : d[v];
        }
      }
    }
    else {
      /* if there is no neighbour left => u is finished and goes from stack */
      RDL_stack_pop(dfs_stack);
    }
  }

  free(edge_elements);
  free(dfs_elements);
  RDL_stack_delete(dfs_stack);
}